

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

Token * __thiscall Tokenizer::getNextToken(Token *__return_storage_ptr__,Tokenizer *this)

{
  __node_base *p_Var1;
  char __rhs;
  _Storage<char,_true> _Var2;
  bool bVar3;
  _Optional_base<char,_true,_true> _Var4;
  int iVar5;
  iterator iVar6;
  iterator iVar7;
  undefined4 *puVar8;
  undefined4 *puVar9;
  long lVar10;
  byte bVar11;
  char c;
  undefined1 local_2fb;
  undefined1 local_2fa;
  undefined1 local_2f9;
  TokenType local_2f8;
  TokenType local_2f4;
  unordered_map<char,_TokenType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_TokenType>_>_>
  singleChars;
  TokenType local_2b4;
  TokenType local_2b0;
  TokenType local_2ac;
  TokenType local_2a8;
  TokenType local_2a4;
  TokenType local_2a0;
  TokenType local_29c;
  TokenType local_298;
  TokenType local_294;
  TokenType local_290;
  TokenType local_28c;
  string nextTwo;
  undefined1 local_268 [40];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  pStack_240;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_218;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_1c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_1a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_178;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_150;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_128;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_100;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_88;
  undefined1 local_60 [8];
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_58;
  
  bVar11 = 0;
  if (this->parsingHeaderBlock == true) {
    getNextHeaderToken((Token *)local_268,this);
    Token::operator=(&this->currentToken,(Token *)local_268);
  }
  else {
    _Var4._M_payload.super__Optional_payload_base<char> =
         (_Optional_payload<char,_true,_true,_true>)next(this);
    _Var2._M_value = c;
    while (c = _Var2._M_value,
          ((ushort)_Var4._M_payload.super__Optional_payload_base<char> >> 8 & 1) != 0) {
      _Var2._M_value = _Var4._M_payload.super__Optional_payload_base<char>._M_payload;
      iVar5 = isspace((int)_Var2._M_value);
      if (iVar5 == 0) {
        c = _Var2._M_value;
        if (_Var2._M_value != '\0') {
          pStack_240.first._M_string_length = 0x80000002c;
          pStack_240.first.field_2._M_allocated_capacity = 0x90000002e;
          local_268._32_8_ = 0x60000003b;
          pStack_240.first._M_dataplus._M_p = (pointer)0x70000003a;
          local_268._16_8_ = 0x40000007b;
          local_268._24_8_ = 0x50000007d;
          local_268._0_4_ = Method;
          local_268._4_4_ = 0;
          local_268._8_4_ = 0x29;
          local_268._12_4_ = 1;
          std::
          _Hashtable<char,std::pair<char_const,TokenType>,std::allocator<std::pair<char_const,TokenType>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_Hashtable<std::pair<char_const,TokenType>const*>
                    ((_Hashtable<char,std::pair<char_const,TokenType>,std::allocator<std::pair<char_const,TokenType>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&singleChars,local_268,(undefined1 *)((long)&pStack_240.first.field_2 + 8),0
                     ,&nextTwo,&local_2f4,&local_2f8);
          iVar6 = std::
                  _Hashtable<char,_std::pair<const_char,_TokenType>,_std::allocator<std::pair<const_char,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&singleChars._M_h,&c);
          if (iVar6.super__Node_iterator_base<std::pair<const_char,_TokenType>,_false>._M_cur !=
              (__node_type *)0x0) {
            local_268._0_4_ =
                 *(TokenType *)
                  ((long)iVar6.super__Node_iterator_base<std::pair<const_char,_TokenType>,_false>.
                         _M_cur + 0xc);
            local_268._8_4_ = 0;
            pStack_240.first._M_dataplus._M_p =
                 pStack_240.first._M_dataplus._M_p & 0xffffffffffffff00;
            Token::operator=(&this->currentToken,(Token *)local_268);
            std::__detail::__variant::
            _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
            ::~_Variant_storage((_Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                                 *)(local_268 + 8));
            Token::Token(__return_storage_ptr__,&this->currentToken);
            std::
            _Hashtable<char,_std::pair<const_char,_TokenType>,_std::allocator<std::pair<const_char,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::~_Hashtable(&singleChars._M_h);
            return __return_storage_ptr__;
          }
          std::
          _Hashtable<char,_std::pair<const_char,_TokenType>,_std::allocator<std::pair<const_char,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&singleChars._M_h);
          if ((ulong)(long)this->pos < (this->program)._M_string_length) {
            __rhs = (this->program)._M_dataplus._M_p[this->pos];
            p_Var1 = &singleChars._M_h._M_before_begin;
            singleChars._M_h._M_bucket_count = 0;
            singleChars._M_h._M_before_begin._M_nxt._0_1_ = 0;
            singleChars._M_h._M_buckets = &p_Var1->_M_nxt;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_268,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &singleChars,c);
            std::operator+(&nextTwo,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_268,__rhs);
            std::__cxx11::string::~string((string *)local_268);
            std::__cxx11::string::~string((string *)&singleChars);
            bVar3 = std::operator==(&nextTwo,"[[");
            if (!bVar3) {
              local_2f4 = Increment;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>
                        ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
                          *)local_268,(char (*) [3])"++",&local_2f4);
              local_2f8 = Decrement;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>(&pStack_240,(char (*) [3])"--",&local_2f8);
              local_28c = PlusEquals;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>(&local_218,(char (*) [3])"+=",&local_28c);
              local_290 = MinusEquals;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>(&local_1f0,(char (*) [3])"-=",&local_290);
              local_294 = MultiplyEquals;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>(&local_1c8,(char (*) [3])"*=",&local_294);
              local_298 = DivideEquals;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>(&local_1a0,(char (*) [3])"/=",&local_298);
              local_29c = ModuloEquals;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>(&local_178,(char (*) [3])"%=",&local_29c);
              local_2a0 = LessThanEquals;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>(&local_150,(char (*) [3])"<=",&local_2a0);
              local_2a4 = GreaterThanEquals;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>(&local_128,(char (*) [3])">=",&local_2a4);
              local_2a8 = DoubleEquals;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>(&local_100,(char (*) [3])"==",&local_2a8);
              local_2ac = And;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>(&local_d8,(char (*) [3])"&&",&local_2ac);
              local_2b0 = Or;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>(&local_b0,(char (*) [3])"||",&local_2b0);
              local_2b4 = NotEquals;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>(&local_88,(char (*) [3])"!=",&local_2b4);
              std::
              _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,TokenType>,std::allocator<std::pair<std::__cxx11::string_const,TokenType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::_Hashtable<std::pair<std::__cxx11::string_const,TokenType>const*>
                        ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,TokenType>,std::allocator<std::pair<std::__cxx11::string_const,TokenType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)&singleChars,local_268,local_60,0,&local_2f9,&local_2fa,&local_2fb);
              lVar10 = 0x1e0;
              do {
                std::__cxx11::string::~string((string *)(local_268 + lVar10));
                lVar10 = lVar10 + -0x28;
              } while (lVar10 != -0x28);
              iVar7 = std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)&singleChars,&nextTwo);
              if (iVar7.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_true>
                  ._M_cur == (__node_type *)0x0) {
                std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)&singleChars);
                puVar8 = &DAT_00115284;
                puVar9 = (undefined4 *)local_268;
                for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
                  *puVar9 = *puVar8;
                  puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
                  puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
                }
                std::
                _Hashtable<char,std::pair<char_const,TokenType>,std::allocator<std::pair<char_const,TokenType>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_Hashtable<std::pair<char_const,TokenType>const*>
                          ((_Hashtable<char,std::pair<char_const,TokenType>,std::allocator<std::pair<char_const,TokenType>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)&singleChars,local_268,&local_218.second,0,&local_2f4,&local_2f8,
                           &local_28c);
                iVar6 = std::
                        _Hashtable<char,_std::pair<const_char,_TokenType>,_std::allocator<std::pair<const_char,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::find(&singleChars._M_h,&c);
                if (iVar6.super__Node_iterator_base<std::pair<const_char,_TokenType>,_false>._M_cur
                    == (__node_type *)0x0) {
                  std::
                  _Hashtable<char,_std::pair<const_char,_TokenType>,_std::allocator<std::pair<const_char,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::~_Hashtable(&singleChars._M_h);
                  if ((int)c - 0x30U < 10) {
                    parseNumber((Token *)local_268,this,c);
                  }
                  else if (c == '`') {
                    parseURL((Token *)local_268,this);
                  }
                  else if (c == '\'') {
                    parseChar((Token *)local_268,this);
                  }
                  else if (c == '\"') {
                    parseString((Token *)local_268,this,'\"');
                  }
                  else {
                    parseName((Token *)local_268,this,c);
                  }
                  Token::operator=(&this->currentToken,(Token *)local_268);
                  std::__detail::__variant::
                  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                  ::~_Variant_storage((_Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                                       *)(local_268 + 8));
LAB_00106386:
                  Token::Token(__return_storage_ptr__,&this->currentToken);
                }
                else {
                  local_268._0_4_ =
                       *(TokenType *)
                        ((long)iVar6.
                               super__Node_iterator_base<std::pair<const_char,_TokenType>,_false>.
                               _M_cur + 0xc);
                  local_268._8_4_ = 0;
                  pStack_240.first._M_dataplus._M_p =
                       pStack_240.first._M_dataplus._M_p & 0xffffffffffffff00;
                  Token::operator=(&this->currentToken,(Token *)local_268);
                  std::__detail::__variant::
                  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                  ::~_Variant_storage((_Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                                       *)(local_268 + 8));
                  Token::Token(__return_storage_ptr__,&this->currentToken);
                  std::
                  _Hashtable<char,_std::pair<const_char,_TokenType>,_std::allocator<std::pair<const_char,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::~_Hashtable(&singleChars._M_h);
                }
              }
              else {
                next(this,1);
                local_268._0_4_ =
                     *(TokenType *)
                      ((long)iVar7.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_true>
                             ._M_cur + 0x28);
                local_268._8_4_ = 0;
                pStack_240.first._M_dataplus._M_p =
                     pStack_240.first._M_dataplus._M_p & 0xffffffffffffff00;
                Token::operator=(&this->currentToken,(Token *)local_268);
                std::__detail::__variant::
                _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                ::~_Variant_storage((_Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                                     *)(local_268 + 8));
                Token::Token(__return_storage_ptr__,&this->currentToken);
                std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)&singleChars);
              }
              std::__cxx11::string::~string((string *)&nextTwo);
              return __return_storage_ptr__;
            }
            next(this,1);
            this->parsingHeaderBlock = true;
            std::__cxx11::string::assign((char *)&this->header_block_name);
            singleChars._M_h._M_bucket_count = 0;
            singleChars._M_h._M_before_begin._M_nxt._0_1_ = 0;
            singleChars._M_h._M_buckets = &p_Var1->_M_nxt;
            std::variant<int,double,std::__cxx11::string,bool,char>::
            variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
                      ((variant<int,double,std::__cxx11::string,bool,char> *)&local_58,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &singleChars);
            local_268._0_4_ = HeaderOpener;
            std::__detail::__variant::
            _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
            ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                               *)(local_268 + 8),
                              (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                               *)&local_58);
            Token::operator=(&this->currentToken,(Token *)local_268);
            std::__detail::__variant::
            _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
            ::~_Variant_storage((_Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                                 *)(local_268 + 8));
            std::__detail::__variant::
            _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
            ::~_Variant_storage(&local_58);
            std::__cxx11::string::~string((string *)&singleChars);
            goto LAB_00106386;
          }
        }
        break;
      }
      _Var4._M_payload.super__Optional_payload_base<char> =
           (_Optional_payload<char,_true,_true,_true>)next(this);
    }
    local_268._8_4_ = 0;
    local_268._0_4_ = Eof;
    pStack_240.first._M_dataplus._M_p = pStack_240.first._M_dataplus._M_p & 0xffffffffffffff00;
    Token::operator=(&this->currentToken,(Token *)local_268);
  }
  std::__detail::__variant::
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  ::~_Variant_storage((_Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                       *)(local_268 + 8));
  Token::Token(__return_storage_ptr__,&this->currentToken);
  return __return_storage_ptr__;
}

Assistant:

Token Tokenizer::getNextToken() {

    if (parsingHeaderBlock) {
        currentToken = getNextHeaderToken();
        return currentToken;
    }
    char c;
    optional<char> _;
    // Get next char of program
    _ = next();
    if (!_.has_value()) {
        currentToken = Token(Eof);
        return currentToken;
    }
    c = _.value();
    // Ignore whitespace
    while (isspace(c)) {
        _ = next();
        if (!_.has_value()) {
            currentToken = Token(Eof);
            return currentToken;
        }
        c = _.value();
    }
    if (!c) {
        currentToken = Token(Eof);
        return currentToken;
    }

    {
        // Find single chars that can't be confused
        unordered_map<char, TokenType> singleChars = {
                {'(', LeftParen},
                {')', RightParen},
                {'{', LeftBrace},
                {'}', RightBrace},
                {';', Semicolon},
                {':', Colon},
                {',', Comma},
                {'.', Dot},
        };
        auto it = singleChars.find(c);

        if (it != singleChars.end()) {
            currentToken = Token(it->second);
            return currentToken;
        }
    }


    _ = peek();
    if (!_.has_value()) {
        currentToken = Token(Eof);
        return currentToken;
    }
    // Find 2-char tokens that could be confused
    string nextTwo = string() + c + _.value();
    if (nextTwo == "[[") {
        next(1);
        parsingHeaderBlock = true;
        header_block_name = "";
        currentToken = Token(HeaderOpener, string());
        return currentToken;
    }
    {
        unordered_map<string, TokenType> doubleChars = {
                {"++", Increment},
                {"--", Decrement},
                {"+=", PlusEquals},
                {"-=", MinusEquals},
                {"*=", MultiplyEquals},
                {"/=", DivideEquals},
                {"%=", ModuloEquals},
                {"<=", LessThanEquals},
                {">=", GreaterThanEquals},
                {"==", DoubleEquals},
                {"&&", And},
                {"||", Or},
                {"!=", NotEquals}
        };
        auto it = doubleChars.find(nextTwo);
        if (it != doubleChars.end()) {
            next(1); // Go one more forward
            currentToken = Token(it->second);
            return currentToken;
        }
    }
    // Find confusable single chars
    {
        unordered_map<char, TokenType> singleChars = {
                {'+', Plus},
                {'-', Minus},
                {'*', Multiply},
                {'/', Divide},
                {'%', Modulo},
                {'=', SingleEquals},
                {'<', LessThan},
                {'>', GreaterThan},
                {'&', BinaryAnd},
                {'|', BinaryOr},
                {'^', BinaryXor},
                {'!', Not},
                {'[', LeftBracket},
                {']', RightBracket},
        };
        auto it = singleChars.find(c);

        if (it != singleChars.end()) {
            currentToken = Token(it->second);
            return currentToken;
        }
    }
    // Integers
    if (isdigit(c)) {
        currentToken = parseNumber(c);
        return currentToken;
    }
    // Strings
    if (c == '"') {
        currentToken = parseString('"');
        return currentToken;
    }
    // URLs
    if (c == '`') {
        currentToken = parseURL();
        return currentToken;
    }
    // Chars
    if (c == '\'') {
        currentToken = parseChar();
        return currentToken;
    }

    currentToken = parseName(c);
    return currentToken;
}